

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O0

void __thiscall
QTextCursorPrivate::selectedTableCells
          (QTextCursorPrivate *this,int *firstRow,int *numRows,int *firstColumn,int *numColumns)

{
  bool bVar1;
  int iVar2;
  QTextTable *pQVar3;
  int *piVar4;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  QTextTableCell *in_RDI;
  int *in_R8;
  long in_FS_OFFSET;
  QTextTable *t;
  QTextTableCell cell_anchor;
  QTextTableCell cell_pos;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  QTextTableCell *pQVar5;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RSI = -1;
  *in_RCX = -1;
  *in_RDX = -1;
  *in_R8 = -1;
  if (in_RDI[1].fragment != *(int *)&in_RDI[1].field_0xc) {
    pQVar5 = in_RDI;
    QTextDocumentPrivate::frameAt
              ((QTextDocumentPrivate *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
               ,(int)((ulong)in_RDI >> 0x20));
    iVar2 = (int)((ulong)pQVar5 >> 0x20);
    pQVar3 = qobject_cast<QTextTable*>((QObject *)0x79fab1);
    if (pQVar3 != (QTextTable *)0x0) {
      local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextTable::cellAt((QTextTable *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                         ,iVar2);
      local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextTable::cellAt((QTextTable *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                         ,iVar2);
      bVar1 = QTextTableCell::operator==((QTextTableCell *)local_18,(QTextTableCell *)local_28);
      if (!bVar1) {
        local_2c = QTextTableCell::row(in_RDI);
        local_30 = QTextTableCell::row(in_RDI);
        piVar4 = qMin<int>(&local_2c,&local_30);
        *in_RSI = *piVar4;
        local_34 = QTextTableCell::column(in_RDI);
        local_38 = QTextTableCell::column(in_RDI);
        piVar4 = qMin<int>(&local_34,&local_38);
        *in_RCX = *piVar4;
        iVar2 = QTextTableCell::row(in_RDI);
        local_3c = QTextTableCell::rowSpan(in_RDI);
        local_3c = iVar2 + local_3c;
        iVar2 = QTextTableCell::row(in_RDI);
        local_40 = QTextTableCell::rowSpan(in_RDI);
        local_40 = iVar2 + local_40;
        piVar4 = qMax<int>(&local_3c,&local_40);
        *in_RDX = *piVar4 - *in_RSI;
        QTextTableCell::column(in_RDI);
        QTextTableCell::columnSpan(in_RDI);
        QTextTableCell::column(in_RDI);
        QTextTableCell::columnSpan(in_RDI);
        piVar4 = qMax<int>((int *)&stack0xffffffffffffffbc,(int *)&stack0xffffffffffffffb8);
        *in_R8 = *piVar4 - *in_RCX;
      }
      QTextTableCell::~QTextTableCell((QTextTableCell *)local_28);
      QTextTableCell::~QTextTableCell((QTextTableCell *)local_18);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextCursorPrivate::selectedTableCells(int *firstRow, int *numRows, int *firstColumn, int *numColumns) const
{
    *firstRow = -1;
    *firstColumn = -1;
    *numRows = -1;
    *numColumns = -1;

    if (position == anchor)
        return;

    QTextTable *t = qobject_cast<QTextTable *>(priv->frameAt(position));
    if (!t)
        return;

    QTextTableCell cell_pos = t->cellAt(position);
    QTextTableCell cell_anchor = t->cellAt(adjusted_anchor);

    Q_ASSERT(cell_anchor.isValid());

    if (cell_pos == cell_anchor)
        return;

    *firstRow = qMin(cell_pos.row(), cell_anchor.row());
    *firstColumn = qMin(cell_pos.column(), cell_anchor.column());
    *numRows = qMax(cell_pos.row() + cell_pos.rowSpan(), cell_anchor.row() + cell_anchor.rowSpan()) - *firstRow;
    *numColumns = qMax(cell_pos.column() + cell_pos.columnSpan(), cell_anchor.column() + cell_anchor.columnSpan()) - *firstColumn;
}